

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O3

void google::protobuf::compiler::cpp::GenerateUtf8CheckCode
               (FieldDescriptor *field,Options *options,bool for_parse,char *parameters,
               char *strict_function,char *verify_function,Formatter *format)

{
  char *format_00;
  char *local_30;
  char *local_28;
  
  local_30 = strict_function;
  local_28 = verify_function;
  if (*(int *)(*(long *)(field + 0x28) + 0x3c) == 3) {
    if (for_parse) {
      Formatter::operator()<>(format,"DO_(");
      Formatter::operator()(format,"::$proto_ns$::internal::WireFormatLite::$1$(\n",&local_30);
      io::Printer::Indent(format->printer_);
      Formatter::operator()<>(format,parameters);
      Formatter::operator()<>(format,"::$proto_ns$::internal::WireFormatLite::PARSE,\n");
      Formatter::operator()
                (format,"\"$1$\")",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(field + 8))
      ;
      Formatter::operator()<>(format,")");
    }
    else {
      Formatter::operator()(format,"::$proto_ns$::internal::WireFormatLite::$1$(\n",&local_30);
      io::Printer::Indent(format->printer_);
      Formatter::operator()<>(format,parameters);
      Formatter::operator()<>(format,"::$proto_ns$::internal::WireFormatLite::SERIALIZE,\n");
      Formatter::operator()
                (format,"\"$1$\")",
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(field + 8))
      ;
    }
    Formatter::operator()<>(format,";\n");
  }
  else {
    if ((int)options != 1) {
      if ((int)options == 2) {
        return;
      }
      if (*(int *)(*(long *)(*(long *)(field + 0x28) + 0x88) + 0xa4) == 3) {
        return;
      }
    }
    Formatter::operator()(format,"::$proto_ns$::internal::WireFormat::$1$(\n",&local_28);
    io::Printer::Indent(format->printer_);
    Formatter::operator()<>(format,parameters);
    format_00 = "::$proto_ns$::internal::WireFormat::SERIALIZE,\n";
    if (for_parse) {
      format_00 = "::$proto_ns$::internal::WireFormat::PARSE,\n";
    }
    Formatter::operator()<>(format,format_00);
    Formatter::operator()
              (format,"\"$1$\");\n",
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(field + 8));
  }
  io::Printer::Outdent(format->printer_);
  return;
}

Assistant:

static void GenerateUtf8CheckCode(const FieldDescriptor* field,
                                  const Options& options, bool for_parse,
                                  const char* parameters,
                                  const char* strict_function,
                                  const char* verify_function,
                                  const Formatter& format) {
  switch (GetUtf8CheckMode(field, options)) {
    case STRICT: {
      if (for_parse) {
        format("DO_(");
      }
      format("::$proto_ns$::internal::WireFormatLite::$1$(\n", strict_function);
      format.Indent();
      format(parameters);
      if (for_parse) {
        format("::$proto_ns$::internal::WireFormatLite::PARSE,\n");
      } else {
        format("::$proto_ns$::internal::WireFormatLite::SERIALIZE,\n");
      }
      format("\"$1$\")", field->full_name());
      if (for_parse) {
        format(")");
      }
      format(";\n");
      format.Outdent();
      break;
    }
    case VERIFY: {
      format("::$proto_ns$::internal::WireFormat::$1$(\n", verify_function);
      format.Indent();
      format(parameters);
      if (for_parse) {
        format("::$proto_ns$::internal::WireFormat::PARSE,\n");
      } else {
        format("::$proto_ns$::internal::WireFormat::SERIALIZE,\n");
      }
      format("\"$1$\");\n", field->full_name());
      format.Outdent();
      break;
    }
    case NONE:
      break;
  }
}